

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::IGXMLScanner::scanDocument(IGXMLScanner *this,InputSource *src)

{
  XMLUInt32 *pXVar1;
  ReaderMgr *this_00;
  XMLDocumentHandler *pXVar2;
  bool bVar3;
  ReaderMgrResetType resetReaderMgr;
  JanitorMemFunCall<xercesc_4_0::ReaderMgr> local_28;
  
  pXVar1 = &(this->super_XMLScanner).fSequenceId;
  *pXVar1 = *pXVar1 + 1;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  local_28.fToCall = (MFPT)ReaderMgr::reset;
  local_28._16_8_ = 0;
  local_28.fObject = this_00;
  (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xf])();
  pXVar2 = (this->super_XMLScanner).fDocHandler;
  if (pXVar2 != (XMLDocumentHandler *)0x0) {
    (*pXVar2->_vptr_XMLDocumentHandler[10])();
  }
  XMLScanner::scanProlog(&this->super_XMLScanner);
  bVar3 = ReaderMgr::atEOF(this_00);
  if (bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,EmptyMainEntity);
  }
  else {
    scanContent(this);
    if ((this->super_XMLScanner).fValidate == true) {
      XMLScanner::checkIDRefs(&this->super_XMLScanner);
    }
    bVar3 = ReaderMgr::atEOF(this_00);
    if (!bVar3) {
      XMLScanner::scanMiscellaneous(&this->super_XMLScanner);
    }
  }
  pXVar2 = (this->super_XMLScanner).fDocHandler;
  if (pXVar2 != (XMLDocumentHandler *)0x0) {
    (*pXVar2->_vptr_XMLDocumentHandler[5])();
  }
  JanitorMemFunCall<xercesc_4_0::ReaderMgr>::~JanitorMemFunCall(&local_28);
  return;
}

Assistant:

void IGXMLScanner::scanDocument(const InputSource& src)
{
    //  Bump up the sequence id for this parser instance. This will invalidate
    //  any previous progressive scan tokens.
    fSequenceId++;

    ReaderMgrResetType  resetReaderMgr(&fReaderMgr, &ReaderMgr::reset);

    try
    {
        //  Reset the scanner and its plugged in stuff for a new run. This
        //  resets all the data structures, creates the initial reader and
        //  pushes it on the stack, and sets up the base document path.
        scanReset(src);

        // If we have a document handler, then call the start document
        if (fDocHandler)
            fDocHandler->startDocument();

        //  Scan the prolog part, which is everything before the root element
        //  including the DTD subsets.
        scanProlog();

        //  If we got to the end of input, then its not a valid XML file.
        //  Else, go on to scan the content.
        if (fReaderMgr.atEOF())
        {
            emitError(XMLErrs::EmptyMainEntity);
        }
        else
        {
            // Scan content, and tell it its not an external entity
            if (scanContent())
            {
                // Do post-parse validation if required
                if (fValidate)
                {
                    //  We handle ID reference semantics at this level since
                    //  its required by XML 1.0.
                    checkIDRefs();

                    // Then allow the validator to do any extra stuff it wants
//                    fValidator->postParseValidation();
                }

                // That went ok, so scan for any miscellaneous stuff
                if (!fReaderMgr.atEOF())
                    scanMiscellaneous();
            }
        }

        // If we have a document handler, then call the end document
        if (fDocHandler)
            fDocHandler->endDocument();

        //cargill debug:
        //fGrammarResolver->getXSModel();
    }
    //  NOTE:
    //
    //  In all of the error processing below, the emitError() call MUST come
    //  before the flush of the reader mgr, or it will fail because it tries
    //  to find out the position in the XML source of the error.
    catch(const XMLErrs::Codes)
    {
        // This is a 'first failure' exception, so fall through
    }
    catch(const XMLValid::Codes)
    {
        // This is a 'first fatal error' type exit, so fall through
    }
    catch(const XMLException& excToCatch)
    {
        //  Emit the error and catch any user exception thrown from here. Make
        //  sure in all cases we flush the reader manager.
        fInException = true;
        try
        {
            if (excToCatch.getErrorType() == XMLErrorReporter::ErrType_Warning)
                emitError
                (
                    XMLErrs::XMLException_Warning
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else if (excToCatch.getErrorType() >= XMLErrorReporter::ErrType_Fatal)
                emitError
                (
                    XMLErrs::XMLException_Fatal
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else
                emitError
                (
                    XMLErrs::XMLException_Error
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
        }
        catch(const OutOfMemoryException&)
        {
            // This is a special case for out-of-memory
            // conditions, because resetting the ReaderMgr
            // can be problematic.
            resetReaderMgr.release();

            throw;
        }
    }
    catch(const OutOfMemoryException&)
    {
        // This is a special case for out-of-memory
        // conditions, because resetting the ReaderMgr
        // can be problematic.
        resetReaderMgr.release();

        throw;
    }
}